

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O0

void __thiscall Triangle_Watertight_Test::TestBody(Triangle_Watertight_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  uint uVar9;
  size_type sVar10;
  float *pfVar11;
  Message *message;
  reference pvVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  undefined8 uVar17;
  char *expr2;
  undefined1 auVar16 [64];
  undefined1 auVar18 [56];
  Vector3f VVar19;
  Vector3<float> VVar20;
  Point3<float> PVar21;
  Tuple3<pbrt::Point3,_float> TVar22;
  Tuple3<pbrt::Vector3,_float> TVar23;
  AssertionResult gtest_ar_4;
  ShapeHandle *tri_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *__range2_1;
  Point3f pVertex;
  AssertionResult gtest_ar_3;
  ShapeHandle *tri;
  iterator __end2;
  iterator __begin2;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *__range2;
  int nHits;
  Ray r;
  Point3f p_4;
  Point2f u;
  RNG rng_1;
  int i;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> tris;
  TriangleMesh mesh;
  Transform identity;
  int p_3;
  int p_2;
  int t_1;
  int p_1;
  anon_class_4_1_898ee721 offset;
  vector<int,_std::allocator<int>_> indices;
  AssertionResult gtest_ar_2;
  Float radius;
  Float phi;
  int p;
  Float sinTheta;
  Float cosTheta;
  Float theta;
  int t;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> vertices;
  int nVertices;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int nPhi;
  int nTheta;
  RNG rng;
  value_type *in_stack_fffffffffffff6b8;
  Point3<float> *val;
  Transform *in_stack_fffffffffffff6c0;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *this_00;
  value_type *in_stack_fffffffffffff6c8;
  Point3<float> *p_00;
  RNG *in_stack_fffffffffffff6d0;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffff6d8;
  Ray *in_stack_fffffffffffff6e0;
  Float in_stack_fffffffffffff6e8;
  undefined2 in_stack_fffffffffffff6ec;
  undefined1 in_stack_fffffffffffff6ee;
  byte in_stack_fffffffffffff6ef;
  AssertHelper *in_stack_fffffffffffff6f0;
  undefined1 in_stack_fffffffffffff708 [16];
  Message *in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff744;
  TriangleMesh *in_stack_fffffffffffff748;
  Allocator in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff774;
  int *in_stack_fffffffffffff778;
  char *in_stack_fffffffffffff780;
  char *in_stack_fffffffffffff788;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *in_stack_fffffffffffff860;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffff870;
  float in_stack_fffffffffffff874;
  undefined1 in_stack_fffffffffffff87f;
  Transform *in_stack_fffffffffffff880;
  TriangleMesh *in_stack_fffffffffffff888;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a8;
  float in_stack_fffffffffffff8ac;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff8b0;
  AssertionResult local_6f8;
  optional<pbrt::ShapeIntersection> local_6e8;
  AssertHelper *local_5e0;
  AssertHelper *local_5d8;
  AssertHelper *local_5d0;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *local_5c8;
  undefined8 local_5c0;
  float local_5b8;
  undefined8 local_5b0;
  float local_5a8;
  undefined8 local_5a0;
  float local_598;
  undefined4 local_57c;
  AssertionResult local_578;
  optional local_568 [264];
  Message *local_460;
  Message *local_458;
  Message *local_450;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *local_448;
  int local_43c;
  undefined8 local_430;
  float local_428;
  undefined8 local_420;
  float local_418;
  undefined8 local_404;
  float local_3fc;
  undefined8 local_3e8;
  float local_3e0;
  undefined8 local_3d8;
  float local_3d0;
  undefined8 local_3c8;
  float local_3c0;
  undefined8 local_3b8;
  float local_3b0;
  undefined8 local_3a8;
  float local_3a0;
  undefined8 local_390;
  float local_388;
  Tuple2<pbrt::Point2,_float> local_380 [3];
  int local_364;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> local_358;
  undefined1 local_338 [16];
  undefined8 local_328;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> local_318;
  undefined1 local_2f8 [16];
  undefined8 local_2e8;
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  int local_188;
  anon_class_4_1_898ee721 local_184 [11];
  size_type local_158;
  AssertionResult local_150;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  undefined8 local_e8;
  float local_e0;
  uint local_c4;
  float local_c0;
  int local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  float local_b0;
  int local_ac;
  vector<int,_std::allocator<int>_> local_a8;
  int local_8c;
  undefined4 local_74;
  AssertionResult local_70;
  uint local_5c;
  undefined4 local_34;
  AssertionResult local_30;
  int local_20;
  int local_1c;
  
  pbrt::RNG::RNG((RNG *)in_stack_fffffffffffff6c0,(uint64_t)in_stack_fffffffffffff6b8);
  local_1c = 0x10;
  local_20 = 0x10;
  local_34 = 3;
  testing::internal::CmpHelperGE<int,int>
            (in_stack_fffffffffffff788,in_stack_fffffffffffff780,in_stack_fffffffffffff778,
             (int *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
  bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar8) {
    testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x5629f2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff6f0,
               CONCAT13(in_stack_fffffffffffff6ef,
                        CONCAT12(in_stack_fffffffffffff6ee,in_stack_fffffffffffff6ec)),
               (char *)in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
               (char *)in_stack_fffffffffffff6d0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
               in_stack_fffffffffffff738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
    testing::Message::~Message((Message *)0x562a55);
  }
  local_5c = (uint)!bVar8;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x562ac3);
  if (local_5c == 0) {
    local_74 = 4;
    testing::internal::CmpHelperGE<int,int>
              (in_stack_fffffffffffff788,in_stack_fffffffffffff780,in_stack_fffffffffffff778,
               (int *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
    bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_70);
    if (!bVar8) {
      testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
      testing::AssertionResult::failure_message((AssertionResult *)0x562b82);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff6f0,
                 CONCAT13(in_stack_fffffffffffff6ef,
                          CONCAT12(in_stack_fffffffffffff6ee,in_stack_fffffffffffff6ec)),
                 (char *)in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
                 (char *)in_stack_fffffffffffff6d0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                 in_stack_fffffffffffff738);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
      testing::Message::~Message((Message *)0x562be5);
    }
    local_5c = (uint)!bVar8;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x562c53);
    if (local_5c == 0) {
      local_8c = local_1c * local_20;
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
                ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)0x562c88);
      for (local_ac = 0; local_ac < local_1c; local_ac = local_ac + 1) {
        local_b0 = ((float)local_ac * 3.1415927) / (float)(local_1c + -1);
        dVar15 = std::cos((double)(ulong)(uint)local_b0);
        local_b4 = SUB84(dVar15,0);
        dVar15 = std::sin((double)(ulong)(uint)local_b0);
        local_b8 = SUB84(dVar15,0);
        for (local_bc = 0; local_bc < local_20; local_bc = local_bc + 1) {
          local_c0 = ((float)local_bc * 6.2831855) / (float)(local_20 + -1);
          local_c4 = 0x3f800000;
          fVar13 = (float)((ulong)in_stack_fffffffffffff6b8 >> 0x20);
          if (local_ac == 0) {
            pbrt::Point3<float>::Point3
                      ((Point3<float> *)in_stack_fffffffffffff6c0,fVar13,
                       SUB84(in_stack_fffffffffffff6b8,0),0.0);
            std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::push_back
                      ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                       in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
          }
          else if (local_ac == local_1c + -1) {
            pbrt::Point3<float>::Point3
                      ((Point3<float> *)in_stack_fffffffffffff6c0,fVar13,
                       SUB84(in_stack_fffffffffffff6b8,0),0.0);
            std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::push_back
                      ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                       in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
          }
          else if (local_bc == local_20 + -1) {
            in_stack_fffffffffffff8b0 = &local_a8;
            sVar10 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                               ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                 *)in_stack_fffffffffffff8b0);
            std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::operator[]
                      ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                       in_stack_fffffffffffff8b0,sVar10 - (long)(local_20 + -1));
            std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::push_back
                      ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                       in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
          }
          else {
            in_stack_fffffffffffff8ac = pbrt::RNG::Uniform<float>((RNG *)in_stack_fffffffffffff6c0);
            auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40a00000),0),
                                     ZEXT416((uint)in_stack_fffffffffffff8ac),ZEXT416(local_c4));
            local_c4 = auVar1._0_4_;
            pbrt::Point3<float>::Point3
                      ((Point3<float> *)in_stack_fffffffffffff6c0,
                       (float)((ulong)in_stack_fffffffffffff6b8 >> 0x20),
                       SUB84(in_stack_fffffffffffff6b8,0),0.0);
            in_stack_fffffffffffff8a0 =
                 (vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)0x0;
            VVar19 = pbrt::SphericalDirection
                               (in_stack_fffffffffffff6e8,
                                (Float)((ulong)in_stack_fffffffffffff6e0 >> 0x20),
                                SUB84(in_stack_fffffffffffff6e0,0));
            local_118 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
            in_stack_fffffffffffff880 = (Transform *)0x0;
            auVar7._8_8_ = in_stack_fffffffffffff8a0;
            auVar7._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            local_120 = vmovlpd_avx(auVar7);
            local_110 = local_120;
            local_108 = local_118;
            VVar20 = pbrt::operator*((float)((ulong)in_stack_fffffffffffff6e0 >> 0x20),
                                     in_stack_fffffffffffff6d8);
            in_stack_fffffffffffff874 = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
            in_stack_fffffffffffff87f = VVar20.super_Tuple3<pbrt::Vector3,_float>.y._3_1_;
            in_stack_fffffffffffff860 =
                 (vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)0x0;
            auVar6._8_8_ = in_stack_fffffffffffff880;
            auVar6._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            local_130 = vmovlpd_avx(auVar6);
            local_128 = in_stack_fffffffffffff874;
            local_100 = local_130;
            local_f8 = in_stack_fffffffffffff874;
            PVar21 = pbrt::Point3<float>::operator+
                               ((Point3<float> *)in_stack_fffffffffffff6d0,
                                (Vector3<float> *)in_stack_fffffffffffff6c8);
            local_138 = PVar21.super_Tuple3<pbrt::Point3,_float>.z;
            auVar1._8_8_ = in_stack_fffffffffffff860;
            auVar1._0_8_ = PVar21.super_Tuple3<pbrt::Point3,_float>._0_8_;
            local_140 = vmovlpd_avx(auVar1);
            local_e8 = local_140;
            local_e0 = local_138;
            std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::push_back
                      ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                       in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8);
          }
        }
      }
      local_158 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                             &local_a8);
      testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                ((char *)in_stack_fffffffffffff6d8,(char *)in_stack_fffffffffffff6d0,
                 (int *)in_stack_fffffffffffff6c8,(unsigned_long *)in_stack_fffffffffffff6c0);
      bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_150);
      if (!bVar8) {
        testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
        testing::AssertionResult::failure_message((AssertionResult *)0x563160);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffff6f0,
                   CONCAT13(in_stack_fffffffffffff6ef,
                            CONCAT12(in_stack_fffffffffffff6ee,in_stack_fffffffffffff6ec)),
                   (char *)in_stack_fffffffffffff6e0,(int)((ulong)in_stack_fffffffffffff6d8 >> 0x20)
                   ,(char *)in_stack_fffffffffffff6d0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                   in_stack_fffffffffffff738);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff6c0);
        testing::Message::~Message((Message *)0x5631c3);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x56321b);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x563228);
      local_184[0].nPhi = local_20;
      for (local_188 = 0; local_188 < local_20 + -1; local_188 = local_188 + 1) {
        local_18c = TestBody::anon_class_4_1_898ee721::operator()(local_184,0,0);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c0,
                   (value_type_conflict3 *)in_stack_fffffffffffff6b8);
        local_190 = TestBody::anon_class_4_1_898ee721::operator()(local_184,1,local_188);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c0,
                   (value_type_conflict3 *)in_stack_fffffffffffff6b8);
        local_194 = TestBody::anon_class_4_1_898ee721::operator()(local_184,1,local_188 + 1);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c0,
                   (value_type_conflict3 *)in_stack_fffffffffffff6b8);
      }
      for (local_198 = 1; local_198 < local_1c + -2; local_198 = local_198 + 1) {
        for (local_19c = 0; local_19c < local_20 + -1; local_19c = local_19c + 1) {
          local_1a0 = TestBody::anon_class_4_1_898ee721::operator()(local_184,local_198,local_19c);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c0,
                     (value_type_conflict3 *)in_stack_fffffffffffff6b8);
          local_1a4 = TestBody::anon_class_4_1_898ee721::operator()
                                (local_184,local_198 + 1,local_19c);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c0,
                     (value_type_conflict3 *)in_stack_fffffffffffff6b8);
          local_1a8 = TestBody::anon_class_4_1_898ee721::operator()
                                (local_184,local_198 + 1,local_19c + 1);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c0,
                     (value_type_conflict3 *)in_stack_fffffffffffff6b8);
          local_1ac = TestBody::anon_class_4_1_898ee721::operator()(local_184,local_198,local_19c);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c0,
                     (value_type_conflict3 *)in_stack_fffffffffffff6b8);
          local_1b0 = TestBody::anon_class_4_1_898ee721::operator()
                                (local_184,local_198 + 1,local_19c + 1);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c0,
                     (value_type_conflict3 *)in_stack_fffffffffffff6b8);
          local_1b4 = TestBody::anon_class_4_1_898ee721::operator()
                                (local_184,local_198,local_19c + 1);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c0,
                     (value_type_conflict3 *)in_stack_fffffffffffff6b8);
        }
      }
      for (local_1b8 = 0; local_1b8 < local_20 + -1; local_1b8 = local_1b8 + 1) {
        local_1bc = TestBody::anon_class_4_1_898ee721::operator()(local_184,local_1c + -1,0);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c0,
                   (value_type_conflict3 *)in_stack_fffffffffffff6b8);
        local_1c0 = TestBody::anon_class_4_1_898ee721::operator()(local_184,local_1c + -2,local_1b8)
        ;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c0,
                   (value_type_conflict3 *)in_stack_fffffffffffff6b8);
        local_1c4 = TestBody::anon_class_4_1_898ee721::operator()
                              (local_184,local_1c + -2,local_1b8 + 1);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6c0,
                   (value_type_conflict3 *)in_stack_fffffffffffff6b8);
      }
      pbrt::Transform::Transform(in_stack_fffffffffffff6c0);
      std::vector<int,_std::allocator<int>_>::vector
                (in_stack_fffffffffffff708._8_8_,in_stack_fffffffffffff708._0_8_);
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
                (in_stack_fffffffffffff708._8_8_,in_stack_fffffffffffff708._0_8_);
      local_2d8 = (undefined1  [16])0x0;
      local_2c8 = 0;
      std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::vector
                ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)0x563736);
      local_2f8._0_4_ = 0.0;
      local_2f8._4_4_ = 0.0;
      local_2f8._8_8_ = 0;
      local_2e8 = 0;
      val = (Point3<float> *)local_2f8;
      std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::vector
                ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)0x563769);
      local_318.alloc.memoryResource = (memory_resource *)0x0;
      local_318.ptr = (ShapeHandle *)0x0;
      local_318.nAlloc = 0;
      this_00 = &local_318;
      std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::vector
                ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)0x56379c);
      local_338._0_4_ = 0.0;
      local_338._4_4_ = 0.0;
      local_338._8_8_ = 0;
      local_328 = 0;
      p_00 = (Point3<float> *)local_338;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5637cf);
      pbrt::TriangleMesh::TriangleMesh
                (in_stack_fffffffffffff888,in_stack_fffffffffffff880,(bool)in_stack_fffffffffffff87f
                 ,(vector<int,_std::allocator<int>_> *)
                  CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                 in_stack_fffffffffffff868,in_stack_fffffffffffff860,in_stack_fffffffffffff8a0,
                 (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                 CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                 in_stack_fffffffffffff8b0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6d0);
      std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~vector
                ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                 in_stack_fffffffffffff6d0);
      std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::~vector
                ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)
                 in_stack_fffffffffffff6d0);
      std::vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::~vector
                ((vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
                 in_stack_fffffffffffff6d0);
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~vector
                ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                 in_stack_fffffffffffff6d0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6d0);
      pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                ((polymorphic_allocator<std::byte> *)this_00);
      pbrt::Triangle::CreateTriangles(in_stack_fffffffffffff748,in_stack_fffffffffffff750);
      for (local_364 = 0; local_364 < 100000; local_364 = local_364 + 1) {
        pbrt::RNG::RNG((RNG *)this_00,(uint64_t)val);
        pbrt::Point2<float>::Point2((Point2<float> *)this_00);
        fVar13 = pbrt::RNG::Uniform<float>((RNG *)this_00);
        pfVar11 = pbrt::Tuple2<pbrt::Point2,_float>::operator[](local_380,0);
        *pfVar11 = fVar13;
        fVar13 = pbrt::RNG::Uniform<float>((RNG *)this_00);
        pfVar11 = pbrt::Tuple2<pbrt::Point2,_float>::operator[](local_380,1);
        *pfVar11 = fVar13;
        uVar17 = 0;
        pbrt::Point3<float>::Point3
                  ((Point3<float> *)this_00,(float)((ulong)val >> 0x20),SUB84(val,0),0.0);
        VVar19 = pbrt::SampleUniformSphere((Point2f *)in_stack_fffffffffffff6e0);
        local_3c0 = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar5._8_8_ = uVar17;
        auVar5._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_3c8 = vmovlpd_avx(auVar5);
        uVar17 = 0;
        local_3b8 = local_3c8;
        local_3b0 = local_3c0;
        VVar20 = pbrt::operator*((float)((ulong)in_stack_fffffffffffff6e0 >> 0x20),
                                 in_stack_fffffffffffff6d8);
        local_3d0 = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
        expr2 = (char *)0x0;
        auVar4._8_8_ = uVar17;
        auVar4._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        local_3d8 = vmovlpd_avx(auVar4);
        local_3a8 = local_3d8;
        local_3a0 = local_3d0;
        TVar22 = (Tuple3<pbrt::Point3,_float>)
                 pbrt::Point3<float>::operator+
                           ((Point3<float> *)in_stack_fffffffffffff6d0,(Vector3<float> *)p_00);
        local_3e0 = TVar22.z;
        auVar3._8_8_ = expr2;
        auVar3._0_8_ = TVar22._0_8_;
        local_3e8 = vmovlpd_avx(auVar3);
        local_390 = local_3e8;
        local_388 = local_3e0;
        fVar13 = pbrt::RNG::Uniform<float>((RNG *)this_00);
        pfVar11 = pbrt::Tuple2<pbrt::Point2,_float>::operator[](local_380,0);
        *pfVar11 = fVar13;
        fVar14 = pbrt::RNG::Uniform<float>((RNG *)this_00);
        pfVar11 = pbrt::Tuple2<pbrt::Point2,_float>::operator[](local_380,1);
        uVar17 = 0;
        *pfVar11 = fVar14;
        TVar23 = (Tuple3<pbrt::Vector3,_float>)
                 pbrt::SampleUniformSphere((Point2f *)in_stack_fffffffffffff6e0);
        local_428 = TVar23.z;
        auVar2._8_8_ = uVar17;
        auVar2._0_8_ = TVar23._0_8_;
        local_430 = vmovlpd_avx(auVar2);
        local_420 = local_430;
        local_418 = local_428;
        pbrt::MediumHandle::TaggedPointer((MediumHandle *)this_00,val);
        auVar16 = ZEXT1664((undefined1  [16])0x0);
        pbrt::Ray::Ray(in_stack_fffffffffffff6e0,(Point3f *)in_stack_fffffffffffff6d8,
                       (Vector3f *)in_stack_fffffffffffff6d0,(Float)((ulong)p_00 >> 0x20),
                       (MediumHandle *)this_00);
        local_43c = 0;
        local_448 = &local_358;
        message = (Message *)
                  pstd::
                  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
                  begin(local_448);
        local_450 = message;
        local_458 = (Message *)
                    pstd::
                    vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                    ::end(local_448);
        while( true ) {
          auVar18 = auVar16._8_56_;
          if (local_450 == local_458) break;
          local_460 = local_450;
          auVar16 = ZEXT464(0x7f800000);
          pbrt::ShapeHandle::Intersect
                    ((ShapeHandle *)
                     CONCAT17(in_stack_fffffffffffff6ef,
                              CONCAT16(in_stack_fffffffffffff6ee,
                                       CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)
                                      )),in_stack_fffffffffffff6e0,
                     (Float)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
          bVar8 = pstd::optional::operator_cast_to_bool(local_568);
          pstd::optional<pbrt::ShapeIntersection>::~optional
                    ((optional<pbrt::ShapeIntersection> *)0x563cc5);
          if (bVar8) {
            local_43c = local_43c + 1;
          }
          local_450 = local_450 + 1;
        }
        local_57c = 1;
        testing::internal::CmpHelperGE<int,int>
                  (in_stack_fffffffffffff788,expr2,TVar22._0_8_,(int *)CONCAT44(TVar22.z,fVar13));
        bVar8 = testing::AssertionResult::operator_cast_to_bool(&local_578);
        if (!bVar8) {
          testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
          testing::AssertionResult::failure_message((AssertionResult *)0x563e4e);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffff6f0,
                     CONCAT13(in_stack_fffffffffffff6ef,
                              CONCAT12(in_stack_fffffffffffff6ee,in_stack_fffffffffffff6ec)),
                     (char *)in_stack_fffffffffffff6e0,
                     (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
                     (char *)in_stack_fffffffffffff6d0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(TVar23.z,in_stack_fffffffffffff740),message);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          testing::Message::~Message((Message *)0x563eab);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x563f03);
        std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size
                  ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)&local_a8);
        uVar9 = pbrt::RNG::Uniform<unsigned_int>
                          (in_stack_fffffffffffff6d0,(uint)((ulong)p_00 >> 0x20),this_00);
        pvVar12 = std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::
                  operator[]((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                             &local_a8,(ulong)uVar9);
        local_598 = (pvVar12->super_Tuple3<pbrt::Point3,_float>).z;
        local_5a0._0_4_ = (pvVar12->super_Tuple3<pbrt::Point3,_float>).x;
        local_5a0._4_4_ = (pvVar12->super_Tuple3<pbrt::Point3,_float>).y;
        VVar20 = pbrt::Point3<float>::operator-((Point3<float> *)in_stack_fffffffffffff6d0,p_00);
        local_5b8 = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar16._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar16._8_56_ = auVar18;
        local_5c0 = vmovlpd_avx(auVar16._0_16_);
        local_43c = 0;
        local_5c8 = &local_358;
        local_5b0 = local_5c0;
        local_5a8 = local_5b8;
        local_404 = local_5c0;
        local_3fc = local_5b8;
        local_5d0 = (AssertHelper *)
                    pstd::
                    vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
                    ::begin(local_5c8);
        in_stack_fffffffffffff6f0 =
             (AssertHelper *)
             pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::
             end(local_5c8);
        local_5d8 = in_stack_fffffffffffff6f0;
        while( true ) {
          if (local_5d0 == local_5d8) break;
          local_5e0 = local_5d0;
          pbrt::ShapeHandle::Intersect
                    ((ShapeHandle *)
                     CONCAT17(in_stack_fffffffffffff6ef,
                              CONCAT16(in_stack_fffffffffffff6ee,
                                       CONCAT24(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8)
                                      )),in_stack_fffffffffffff6e0,
                     (Float)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
          in_stack_fffffffffffff6ef = pstd::optional<pbrt::ShapeIntersection>::has_value(&local_6e8)
          ;
          pstd::optional<pbrt::ShapeIntersection>::~optional
                    ((optional<pbrt::ShapeIntersection> *)0x56409a);
          if ((in_stack_fffffffffffff6ef & 1) != 0) {
            local_43c = local_43c + 1;
          }
          local_5d0 = local_5d0 + 1;
        }
        testing::internal::CmpHelperGE<int,int>
                  (in_stack_fffffffffffff788,expr2,TVar22._0_8_,(int *)CONCAT44(TVar22.z,fVar13));
        in_stack_fffffffffffff6ee = testing::AssertionResult::operator_cast_to_bool(&local_6f8);
        if (!(bool)in_stack_fffffffffffff6ee) {
          testing::Message::Message((Message *)in_stack_fffffffffffff6f0);
          in_stack_fffffffffffff6e0 = (Ray *)testing::Message::operator<<((Message *)this_00,val);
          in_stack_fffffffffffff6d8 =
               (Tuple3<pbrt::Vector3,_float> *)
               testing::AssertionResult::failure_message((AssertionResult *)0x5641b5);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffff6f0,
                     CONCAT13(in_stack_fffffffffffff6ef,
                              CONCAT12(in_stack_fffffffffffff6ee,in_stack_fffffffffffff6ec)),
                     (char *)in_stack_fffffffffffff6e0,
                     (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20),
                     (char *)in_stack_fffffffffffff6d0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(TVar23.z,in_stack_fffffffffffff740),message);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          testing::Message::~Message((Message *)0x56420f);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x564264);
      }
      pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::~vector
                (this_00);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6d0);
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~vector
                ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                 in_stack_fffffffffffff6d0);
    }
  }
  return;
}

Assistant:

TEST(Triangle, Watertight) {
    RNG rng(12111);
    int nTheta = 16, nPhi = 16;
    ASSERT_GE(nTheta, 3);
    ASSERT_GE(nPhi, 4);

    // Make a triangle mesh representing a triangulated sphere (with
    // vertices randomly offset along their normal), centered at the
    // origin.
    int nVertices = nTheta * nPhi;
    std::vector<Point3f> vertices;
    for (int t = 0; t < nTheta; ++t) {
        Float theta = Pi * (Float)t / (Float)(nTheta - 1);
        Float cosTheta = std::cos(theta);
        Float sinTheta = std::sin(theta);
        for (int p = 0; p < nPhi; ++p) {
            Float phi = 2 * Pi * (Float)p / (Float)(nPhi - 1);
            Float radius = 1;
            // Make sure all of the top and bottom vertices are coincident.
            if (t == 0)
                vertices.push_back(Point3f(0, 0, radius));
            else if (t == nTheta - 1)
                vertices.push_back(Point3f(0, 0, -radius));
            else if (p == nPhi - 1)
                // Close it up exactly at the end
                vertices.push_back(vertices[vertices.size() - (nPhi - 1)]);
            else {
                radius += 5 * rng.Uniform<Float>();
                vertices.push_back(Point3f(0, 0, 0) +
                                   radius * SphericalDirection(sinTheta, cosTheta, phi));
            }
        }
    }
    EXPECT_EQ(nVertices, vertices.size());

    std::vector<int> indices;
    // fan at top
    auto offset = [nPhi](int t, int p) { return t * nPhi + p; };
    for (int p = 0; p < nPhi - 1; ++p) {
        indices.push_back(offset(0, 0));
        indices.push_back(offset(1, p));
        indices.push_back(offset(1, p + 1));
    }

    // quads in the middle rows
    for (int t = 1; t < nTheta - 2; ++t) {
        for (int p = 0; p < nPhi - 1; ++p) {
            indices.push_back(offset(t, p));
            indices.push_back(offset(t + 1, p));
            indices.push_back(offset(t + 1, p + 1));

            indices.push_back(offset(t, p));
            indices.push_back(offset(t + 1, p + 1));
            indices.push_back(offset(t, p + 1));
        }
    }

    // fan at bottom
    for (int p = 0; p < nPhi - 1; ++p) {
        indices.push_back(offset(nTheta - 1, 0));
        indices.push_back(offset(nTheta - 2, p));
        indices.push_back(offset(nTheta - 2, p + 1));
    }

    Transform identity;
    TriangleMesh mesh(identity, false, indices, vertices, {}, {}, {}, {});
    pstd::vector<ShapeHandle> tris = Triangle::CreateTriangles(&mesh, Allocator());

    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        // Choose a random point in sphere of radius 0.5 around the origin.
        Point2f u;
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        Point3f p = Point3f(0, 0, 0) + Float(0.5) * SampleUniformSphere(u);

        // Choose a random direction.
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        Ray r(p, SampleUniformSphere(u));
        int nHits = 0;
        for (const auto &tri : tris) {
            if (tri.Intersect(r))
                ++nHits;
        }
        EXPECT_GE(nHits, 1);

        // Now tougher: shoot directly at a vertex.
        Point3f pVertex = vertices[rng.Uniform<uint32_t>(vertices.size())];
        r.d = pVertex - r.o;
        nHits = 0;
        for (const auto &tri : tris) {
            if (tri.Intersect(r).has_value())
                ++nHits;
        }
        EXPECT_GE(nHits, 1) << pVertex;
    }
}